

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_ffh_tonumber(lua_State *L)

{
  int iVar1;
  CType *pCVar2;
  GCstr *pGVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  lua_Number local_f8;
  lua_Number n;
  unsigned_long ul;
  byte *pbStack_e0;
  uint neg;
  char *ep;
  char *p;
  CType *ct;
  CTState *cts;
  TValue *o;
  CTState *pCStack_b0;
  int32_t base;
  lua_State *L_local;
  TValue *local_70;
  CTState *local_68;
  CTState *cts_1;
  CType *local_58;
  CType *local_50;
  uint local_44;
  CType *local_40;
  undefined4 local_34;
  CType *local_30;
  undefined4 local_24;
  CType *local_20;
  uint local_14;
  CType *local_10;
  
  pCStack_b0 = (CTState *)L;
  o._4_4_ = lj_lib_optint(L,2,10);
  if (o._4_4_ == 10) {
    cts = (CTState *)lj_lib_checkany((lua_State *)pCStack_b0,1);
    bVar5 = true;
    local_70 = (TValue *)cts;
    if ((0xfffffff2 < (uint)((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)cts).it >> 0xf)) &&
       (bVar5 = false, (int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)cts).it >> 0xf == -5)) {
      iVar1 = lj_strscan_num((GCstr *)(*(ulong *)cts & 0x7fffffffffff),(TValue *)cts);
      bVar5 = iVar1 != 0;
    }
    if (bVar5) {
      ((TValue *)pCStack_b0->finalizer)[-2].gcr.gcptr64 = (uint64_t)cts->tab;
      return 2;
    }
    if ((int)((long)cts->tab >> 0x2f) == -0xb) {
      cts_1 = pCStack_b0;
      ct = *(CType **)(((MRef *)&pCStack_b0->L)->ptr64 + 0x180);
      ((CTState *)ct)->L = (lua_State *)pCStack_b0;
      local_68 = (CTState *)ct;
      pCVar2 = lj_ctype_rawref((CTState *)ct,
                               (uint)*(ushort *)(((ulong)cts->tab & 0x7fffffffffff) + 10));
      p = (char *)pCVar2;
      if (pCVar2->info >> 0x1c == 5) {
        local_50 = ct;
        local_44 = pCVar2->info & 0xffff;
        local_40 = ct;
        local_10 = ct;
        p = (char *)(*(long *)ct + (ulong)local_44 * 0x18);
        local_58 = pCVar2;
        local_14 = local_44;
      }
      if ((*(uint *)p >> 0x1c == 0) || ((*(uint *)p & 0xf4000000) == 0x34000000)) {
        local_30 = ct;
        local_34 = 0xe;
        local_20 = ct;
        local_24 = 0xe;
        lj_cconv_ct_tv((CTState *)ct,(CType *)(*(long *)ct + 0x150),
                       (uint8_t *)&((TValue *)pCStack_b0->finalizer)[-2].u64,(TValue *)cts,0);
        return 2;
      }
    }
  }
  else {
    pGVar3 = lj_lib_checkstr((lua_State *)pCStack_b0,1);
    ep = (char *)(pGVar3 + 1);
    bVar5 = false;
    if ((o._4_4_ < 2) || (0x24 < o._4_4_)) {
      lj_err_arg((lua_State *)pCStack_b0,2,LJ_ERR_BASERNG);
    }
    while ((""[(ulong)(byte)*ep + 1] & 2) != 0) {
      ep = ep + 1;
    }
    if (*ep == '-') {
      ep = ep + 1;
      bVar5 = true;
    }
    else if (*ep == '+') {
      ep = ep + 1;
    }
    if (((""[(ulong)(byte)*ep + 1] & 0x68) != 0) &&
       (uVar4 = strtoul(ep,(char **)&stack0xffffffffffffff20,o._4_4_), (byte *)ep != pbStack_e0)) {
      while ((""[(ulong)*pbStack_e0 + 1] & 2) != 0) {
        pbStack_e0 = pbStack_e0 + 1;
      }
      if (*pbStack_e0 == 0) {
        auVar6._8_4_ = (int)(uVar4 >> 0x20);
        auVar6._0_8_ = uVar4;
        auVar6._12_4_ = 0x45300000;
        local_f8 = (auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
        if (bVar5) {
          local_f8 = -local_f8;
        }
        ((TValue *)pCStack_b0->finalizer)[-2].n = local_f8;
        return 2;
      }
    }
  }
  ((TValue *)pCStack_b0->finalizer)[-2].u64 = 0xffffffffffffffff;
  return 2;
}

Assistant:

LJLIB_ASM(tonumber)		LJLIB_REC(.)
{
  int32_t base = lj_lib_optint(L, 2, 10);
  if (base == 10) {
    TValue *o = lj_lib_checkany(L, 1);
    if (lj_strscan_numberobj(o)) {
      copyTV(L, L->base-1-LJ_FR2, o);
      return FFH_RES(1);
    }
#if LJ_HASFFI
    if (tviscdata(o)) {
      CTState *cts = ctype_cts(L);
      CType *ct = lj_ctype_rawref(cts, cdataV(o)->ctypeid);
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
	if (LJ_DUALNUM && ctype_isinteger_or_bool(ct->info) &&
	    ct->size <= 4 && !(ct->size == 4 && (ct->info & CTF_UNSIGNED))) {
	  int32_t i;
	  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o, 0);
	  setintV(L->base-1-LJ_FR2, i);
	  return FFH_RES(1);
	}
	lj_cconv_ct_tv(cts, ctype_get(cts, CTID_DOUBLE),
		       (uint8_t *)&(L->base-1-LJ_FR2)->n, o, 0);
	return FFH_RES(1);
      }
    }
#endif
  } else {
    const char *p = strdata(lj_lib_checkstr(L, 1));
    char *ep;
    unsigned int neg = 0;
    unsigned long ul;
    if (base < 2 || base > 36)
      lj_err_arg(L, 2, LJ_ERR_BASERNG);
    while (lj_char_isspace((unsigned char)(*p))) p++;
    if (*p == '-') { p++; neg = 1; } else if (*p == '+') { p++; }
    if (lj_char_isalnum((unsigned char)(*p))) {
      ul = strtoul(p, &ep, base);
      if (p != ep) {
	while (lj_char_isspace((unsigned char)(*ep))) ep++;
	if (*ep == '\0') {
	  if (LJ_DUALNUM && LJ_LIKELY(ul < 0x80000000u+neg)) {
	    if (neg) ul = (unsigned long)-(long)ul;
	    setintV(L->base-1-LJ_FR2, (int32_t)ul);
	  } else {
	    lua_Number n = (lua_Number)ul;
	    if (neg) n = -n;
	    setnumV(L->base-1-LJ_FR2, n);
	  }
	  return FFH_RES(1);
	}
      }
    }
  }
  setnilV(L->base-1-LJ_FR2);
  return FFH_RES(1);
}